

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall
Chainstate::ActivateBestChain
          (Chainstate *this,BlockValidationState *state,shared_ptr<const_CBlock> pblock)

{
  ValidationSignals *pVVar1;
  pointer ppCVar2;
  CBlockHeader *this_00;
  uint256 *puVar3;
  pointer pPVar4;
  Notifications *pNVar5;
  uchar *puVar6;
  string_view source_file;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ChainstateRole role;
  uint uVar11;
  Logger *pLVar12;
  size_t sVar13;
  CBlockIndex *pindexMostWork;
  vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_> *pvVar14;
  CBlockIndex *pCVar15;
  Chainstate *pCVar16;
  ChainstateManager *pCVar17;
  CBlockIndex **ppCVar18;
  element_type *pblock_00;
  int iVar19;
  pointer pPVar20;
  RecursiveMutex *pmutexIn;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  string_view str;
  string_view logging_function;
  shared_ptr<const_CBlock> nullBlockPtr;
  bool fInvalidFound;
  CBlockIndex *pindexNewTip;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock21;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  ConnectTrace connectTrace;
  string log_msg;
  CBlockIndex *local_130;
  undefined1 local_108 [23];
  bool local_f1;
  CBlockIndex *local_f0;
  unique_lock<std::mutex> local_e8;
  unique_lock<std::recursive_mutex> local_d8 [2];
  unique_lock<std::recursive_mutex> local_b8 [2];
  undefined1 local_98 [16];
  pointer local_88;
  string local_78;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8._M_owns = false;
  local_e8._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_e8);
  local_58 = (undefined1  [8])&cs_main;
  uStack_50 = uStack_50 & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_58);
  bVar7 = this->m_disabled;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_58);
  if (bVar7 == true) {
    pLVar12 = LogInstance();
    bVar7 = BCLog::Logger::Enabled(pLVar12);
    if (bVar7) {
      uStack_50 = 0;
      local_48 = '\0';
      local_58 = (undefined1  [8])&stack0xffffffffffffffb8;
      tinyformat::format<char[42]>
                (&local_78,
                 "m_disabled is set - this chainstate should not be in operation. Please report this as a bug. %s\n"
                 ,(char (*) [42])"https://github.com/bitcoin/bitcoin/issues");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT17(local_78.field_2._M_local_buf[7],
                                 CONCAT16(local_78.field_2._M_local_buf[6],
                                          CONCAT15(local_78.field_2._M_local_buf[5],
                                                   CONCAT14(local_78.field_2._M_local_buf[4],
                                                            CONCAT13(local_78.field_2._M_local_buf
                                                                     [3],CONCAT12(local_78.field_2.
                                                                                  _M_local_buf[2],
                                                                                  CONCAT11(local_78.
                                                  field_2._M_local_buf[1],
                                                  local_78.field_2._M_local_buf[0]))))))) + 1);
      }
      pLVar12 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x57;
      local_78._M_string_length = 0x837769;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x57;
      str._M_str = (char *)local_58;
      str._M_len = uStack_50;
      logging_function._M_str = "ActivateBestChain";
      logging_function._M_len = 0x11;
      BCLog::Logger::LogPrintStr(pLVar12,str,logging_function,source_file,0xd83,ALL,Info);
      if (local_58 != (undefined1  [8])&stack0xffffffffffffffb8) {
        operator_delete((void *)local_58,
                        CONCAT17(uStack_41,
                                 CONCAT16(uStack_42,
                                          CONCAT15(uStack_43,
                                                   CONCAT14(uStack_44,
                                                            CONCAT13(uStack_45,
                                                                     CONCAT12(uStack_46,
                                                                              CONCAT11(uStack_47,
                                                                                       local_48)))))
                                         )) + 1);
      }
    }
LAB_00406180:
    bVar7 = false;
  }
  else {
    local_f0 = (CBlockIndex *)0x0;
    pindexMostWork = (CBlockIndex *)0x0;
    bVar7 = false;
    do {
      pVVar1 = (this->m_chainman->m_options).signals;
      if ((pVVar1 != (ValidationSignals *)0x0) &&
         (sVar13 = ValidationSignals::CallbacksPending(pVVar1), 10 < sVar13)) {
        ValidationSignals::SyncWithValidationInterfaceQueue(pVVar1);
      }
      local_b8[0]._M_device = &cs_main.super_recursive_mutex;
      local_b8[0]._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(local_b8);
      pmutexIn = &this->m_mempool->cs;
      if (this->m_mempool == (CTxMemPool *)0x0) {
        pmutexIn = (RecursiveMutex *)0x0;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_d8,pmutexIn,
                 "MempoolMutex()",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                 ,0xd97,false);
      bVar8 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
      ppCVar2 = (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar2 ==
          (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_130 = (CBlockIndex *)0x0;
      }
      else {
        local_130 = ppCVar2[-1];
      }
      bVar10 = false;
      while( true ) {
        local_98 = (undefined1  [16])0x0;
        local_88 = (pointer)0x0;
        local_98._0_8_ = operator_new(0x18);
        local_88 = (pointer)(*(undefined1 (*) [16])(local_98._0_8_ + 0x10) + 8);
        *(undefined1 (*) [16])local_98._0_8_ = (undefined1  [16])0x0;
        *(undefined8 *)*(undefined1 (*) [16])(local_98._0_8_ + 0x10) = 0;
        local_98._8_8_ = local_88;
        if ((pindexMostWork == (CBlockIndex *)0x0) &&
           (pindexMostWork = FindMostWorkChain(this), pindexMostWork == (CBlockIndex *)0x0)) break;
        ppCVar2 = (this->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar2 ==
            (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pCVar15 = (CBlockIndex *)0x0;
        }
        else {
          pCVar15 = ppCVar2[-1];
        }
        if (pindexMostWork == pCVar15) goto LAB_00405f70;
        local_f1 = false;
        local_108._0_16_ = (undefined1  [16])0x0;
        this_00 = *(CBlockHeader **)
                   &(pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_CBlockHeader;
        if (this_00 == (CBlockHeader *)0x0) {
LAB_00405e39:
          pblock_00 = (element_type *)local_108;
        }
        else {
          CBlockHeader::GetHash((uint256 *)local_58,this_00);
          puVar3 = pindexMostWork->phashBlock;
          if (puVar3 == (uint256 *)0x0) {
            __assert_fail("phashBlock != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                          ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
          }
          local_78._M_dataplus._M_p = *(pointer *)(puVar3->super_base_blob<256U>).m_data._M_elems;
          puVar6 = (puVar3->super_base_blob<256U>).m_data._M_elems + 8;
          local_78._M_string_length = *(size_type *)puVar6;
          local_78.field_2._M_local_buf[0] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x10];
          local_78.field_2._M_local_buf[1] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x11];
          local_78.field_2._M_local_buf[2] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x12];
          local_78.field_2._M_local_buf[3] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x13];
          local_78.field_2._M_local_buf[4] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x14];
          local_78.field_2._M_local_buf[5] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x15];
          local_78.field_2._M_local_buf[6] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x16];
          local_78.field_2._M_local_buf[7] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x17];
          local_78.field_2._M_local_buf[8] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x18];
          local_78.field_2._M_local_buf[9] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x19];
          local_78.field_2._M_local_buf[10] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1a];
          local_78.field_2._M_local_buf[0xb] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1b]
          ;
          local_78.field_2._M_local_buf[0xc] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1c]
          ;
          local_78.field_2._M_local_buf[0xd] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1d]
          ;
          local_78.field_2._M_local_buf[0xe] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1e]
          ;
          local_78.field_2._M_local_buf[0xf] = (puVar3->super_base_blob<256U>).m_data._M_elems[0x1f]
          ;
          auVar22[0] = -(local_48 == local_78.field_2._M_local_buf[0]);
          auVar22[1] = -(uStack_47 == local_78.field_2._M_local_buf[1]);
          auVar22[2] = -(uStack_46 == local_78.field_2._M_local_buf[2]);
          auVar22[3] = -(uStack_45 == local_78.field_2._M_local_buf[3]);
          auVar22[4] = -(uStack_44 == local_78.field_2._M_local_buf[4]);
          auVar22[5] = -(uStack_43 == local_78.field_2._M_local_buf[5]);
          auVar22[6] = -(uStack_42 == local_78.field_2._M_local_buf[6]);
          auVar22[7] = -(uStack_41 == local_78.field_2._M_local_buf[7]);
          auVar22[8] = -(uStack_40 == local_78.field_2._M_local_buf[8]);
          auVar22[9] = -(uStack_3f == local_78.field_2._M_local_buf[9]);
          auVar22[10] = -(uStack_3e == local_78.field_2._M_local_buf[10]);
          auVar22[0xb] = -(uStack_3d == local_78.field_2._M_local_buf[0xb]);
          auVar22[0xc] = -(uStack_3c == local_78.field_2._M_local_buf[0xc]);
          auVar22[0xd] = -(uStack_3b == local_78.field_2._M_local_buf[0xd]);
          auVar22[0xe] = -(uStack_3a == local_78.field_2._M_local_buf[0xe]);
          auVar22[0xf] = -(uStack_39 == local_78.field_2._M_local_buf[0xf]);
          auVar21[0] = -(local_58[0] == (puVar3->super_base_blob<256U>).m_data._M_elems[0]);
          auVar21[1] = -(local_58[1] == (puVar3->super_base_blob<256U>).m_data._M_elems[1]);
          auVar21[2] = -(local_58[2] == (puVar3->super_base_blob<256U>).m_data._M_elems[2]);
          auVar21[3] = -(local_58[3] == (puVar3->super_base_blob<256U>).m_data._M_elems[3]);
          auVar21[4] = -(local_58[4] == (puVar3->super_base_blob<256U>).m_data._M_elems[4]);
          auVar21[5] = -(local_58[5] == (puVar3->super_base_blob<256U>).m_data._M_elems[5]);
          auVar21[6] = -(local_58[6] == (puVar3->super_base_blob<256U>).m_data._M_elems[6]);
          auVar21[7] = -(local_58[7] == (puVar3->super_base_blob<256U>).m_data._M_elems[7]);
          auVar21[8] = -(uStack_50._0_1_ == (bool)*puVar6);
          auVar21[9] = -(uStack_50._1_1_ == (puVar3->super_base_blob<256U>).m_data._M_elems[9]);
          auVar21[10] = -(uStack_50._2_1_ == (puVar3->super_base_blob<256U>).m_data._M_elems[10]);
          auVar21[0xb] = -(uStack_50._3_1_ == (puVar3->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar21[0xc] = -(uStack_50._4_1_ == (puVar3->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar21[0xd] = -(uStack_50._5_1_ == (puVar3->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar21[0xe] = -(uStack_50._6_1_ == (puVar3->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar21[0xf] = -(uStack_50._7_1_ == (puVar3->super_base_blob<256U>).m_data._M_elems[0xf]);
          auVar21 = auVar21 & auVar22;
          pblock_00 = pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00405e39;
        }
        bVar9 = ActivateBestChainStep
                          (this,state,pindexMostWork,(shared_ptr<const_CBlock> *)pblock_00,&local_f1
                           ,(ConnectTrace *)local_98);
        iVar19 = 1;
        if (bVar9) {
          if (local_f1 != false) {
            pindexMostWork = (CBlockIndex *)0x0;
          }
          ppCVar2 = (this->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          local_f0 = (CBlockIndex *)0x0;
          if (ppCVar2 !=
              (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_f0 = ppCVar2[-1];
          }
          pvVar14 = ConnectTrace::GetBlocksConnected((ConnectTrace *)local_98);
          pPVar4 = (pvVar14->
                   super__Vector_base<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pPVar20 = (pvVar14->
                         super__Vector_base<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>
                         )._M_impl.super__Vector_impl_data._M_start; pPVar20 != pPVar4;
              pPVar20 = pPVar20 + 1) {
            if (((pPVar20->pblock).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr == (element_type *)0x0) || (pPVar20->pindex == (CBlockIndex *)0x0)) {
              __assert_fail("trace.pblock && trace.pindex",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                            ,0xdb8,
                            "bool Chainstate::ActivateBestChain(BlockValidationState &, std::shared_ptr<const CBlock>)"
                           );
            }
            pVVar1 = (this->m_chainman->m_options).signals;
            if (pVVar1 != (ValidationSignals *)0x0) {
              role = GetRole(this);
              ValidationSignals::BlockConnected(pVVar1,role,&pPVar20->pblock,pPVar20->pindex);
            }
          }
          iVar19 = (uint)this->m_disabled << 2;
          bVar10 = true;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
        }
        std::vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>::~vector
                  ((vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_> *)local_98);
        if (iVar19 != 0) {
          if (iVar19 != 4) {
            std::unique_lock<std::recursive_mutex>::~unique_lock(local_d8);
            std::unique_lock<std::recursive_mutex>::~unique_lock(local_b8);
            goto LAB_00406180;
          }
          goto joined_r0x00406142;
        }
        ppCVar2 = (this->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (((ppCVar2 !=
              (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start) &&
            (pCVar15 = ppCVar2[-1], pCVar15 != (CBlockIndex *)0x0)) &&
           ((local_130 == (CBlockIndex *)0x0 ||
            (bVar9 = ::node::CBlockIndexWorkComparator::operator()
                               ((CBlockIndexWorkComparator *)local_58,pCVar15,local_130), !bVar9))))
        goto joined_r0x00406142;
      }
      pindexMostWork = (CBlockIndex *)0x0;
LAB_00405f70:
      std::vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>::~vector
                ((vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_> *)local_98);
joined_r0x00406142:
      if (!bVar10) {
        std::unique_lock<std::recursive_mutex>::~unique_lock(local_d8);
        std::unique_lock<std::recursive_mutex>::~unique_lock(local_b8);
        bVar7 = true;
        goto LAB_00406182;
      }
      pCVar15 = CChain::FindFork(&this->m_chain,local_130);
      bVar10 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
      pCVar16 = ChainstateManager::ActiveChainstate(this->m_chainman);
      if ((pCVar16 == this) && (pCVar15 != local_f0)) {
        pCVar17 = this->m_chainman;
        pVVar1 = (pCVar17->m_options).signals;
        if (pVVar1 != (ValidationSignals *)0x0) {
          ValidationSignals::UpdatedBlockTip(pVVar1,local_f0,pCVar15,bVar10);
          pCVar17 = this->m_chainman;
        }
        pNVar5 = (pCVar17->m_options).notifications;
        uVar11 = (pCVar17->m_blockman).m_blockfiles_indexed._M_base._M_i & 1;
        if (!bVar10) {
          uVar11 = 2;
        }
        uVar11 = (*pNVar5->_vptr_Notifications[2])(pNVar5,(ulong)uVar11,local_f0);
        if ((uVar11 & 0xff00) == 0x100) {
          std::unique_lock<std::recursive_mutex>::~unique_lock(local_d8);
          std::unique_lock<std::recursive_mutex>::~unique_lock(local_b8);
          break;
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(local_d8);
      if (((this->m_chainman->m_options).signals != (ValidationSignals *)0x0) &&
         (pCVar16 = ChainstateManager::ActiveChainstate(this->m_chainman), pCVar16 == this)) {
        pVVar1 = (this->m_chainman->m_options).signals;
        ppCVar18 = inline_assertion_check<true,CBlockIndex*&>
                             (&local_f0,
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                              ,0xde5,"ActivateBestChain","pindexNewTip");
        pCVar15 = *ppCVar18;
        bVar9 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
        ValidationSignals::ActiveTipChange(pVVar1,pCVar15,bVar9);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(local_b8);
      if (bVar7 || bVar8 && !bVar10) {
        local_58 = (undefined1  [8])&cs_main;
        uStack_50 = uStack_50 & 0xffffffffffffff00;
        std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_58);
        ChainstateManager::MaybeRebalanceCaches(this->m_chainman);
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)local_58);
      }
      local_58 = (undefined1  [8])&cs_main;
      uStack_50 = uStack_50 & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_58);
      bVar9 = this->m_disabled;
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_58);
      pCVar17 = this->m_chainman;
      if (bVar9 == true) {
        if ((pCVar17->restart_indexes).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(pCVar17->restart_indexes)._M_invoker)((_Any_data *)&pCVar17->restart_indexes);
        }
        break;
      }
      bVar9 = util::SignalInterrupt::operator_cast_to_bool(pCVar17->m_interrupt);
      bVar7 = (bool)(bVar7 | (bVar8 && !bVar10));
    } while (!bVar9 && local_f0 != pindexMostWork);
    ChainstateManager::CheckBlockIndex(this->m_chainman);
    bVar7 = FlushStateToDisk(this,state,PERIODIC,0);
  }
LAB_00406182:
  std::unique_lock<std::mutex>::~unique_lock(&local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::ActivateBestChain(BlockValidationState& state, std::shared_ptr<const CBlock> pblock)
{
    AssertLockNotHeld(m_chainstate_mutex);

    // Note that while we're often called here from ProcessNewBlock, this is
    // far from a guarantee. Things in the P2P/RPC will often end up calling
    // us in the middle of ProcessNewBlock - do not assume pblock is set
    // sanely for performance or correctness!
    AssertLockNotHeld(::cs_main);

    // ABC maintains a fair degree of expensive-to-calculate internal state
    // because this function periodically releases cs_main so that it does not lock up other threads for too long
    // during large connects - and to allow for e.g. the callback queue to drain
    // we use m_chainstate_mutex to enforce mutual exclusion so that only one caller may execute this function at a time
    LOCK(m_chainstate_mutex);

    // Belt-and-suspenders check that we aren't attempting to advance the background
    // chainstate past the snapshot base block.
    if (WITH_LOCK(::cs_main, return m_disabled)) {
        LogPrintf("m_disabled is set - this chainstate should not be in operation. "
            "Please report this as a bug. %s\n", PACKAGE_BUGREPORT);
        return false;
    }

    CBlockIndex *pindexMostWork = nullptr;
    CBlockIndex *pindexNewTip = nullptr;
    bool exited_ibd{false};
    do {
        // Block until the validation queue drains. This should largely
        // never happen in normal operation, however may happen during
        // reindex, causing memory blowup if we run too far ahead.
        // Note that if a validationinterface callback ends up calling
        // ActivateBestChain this may lead to a deadlock! We should
        // probably have a DEBUG_LOCKORDER test for this in the future.
        if (m_chainman.m_options.signals) LimitValidationInterfaceQueue(*m_chainman.m_options.signals);

        {
            LOCK(cs_main);
            {
            // Lock transaction pool for at least as long as it takes for connectTrace to be consumed
            LOCK(MempoolMutex());
            const bool was_in_ibd = m_chainman.IsInitialBlockDownload();
            CBlockIndex* starting_tip = m_chain.Tip();
            bool blocks_connected = false;
            do {
                // We absolutely may not unlock cs_main until we've made forward progress
                // (with the exception of shutdown due to hardware issues, low disk space, etc).
                ConnectTrace connectTrace; // Destructed before cs_main is unlocked

                if (pindexMostWork == nullptr) {
                    pindexMostWork = FindMostWorkChain();
                }

                // Whether we have anything to do at all.
                if (pindexMostWork == nullptr || pindexMostWork == m_chain.Tip()) {
                    break;
                }

                bool fInvalidFound = false;
                std::shared_ptr<const CBlock> nullBlockPtr;
                if (!ActivateBestChainStep(state, pindexMostWork, pblock && pblock->GetHash() == pindexMostWork->GetBlockHash() ? pblock : nullBlockPtr, fInvalidFound, connectTrace)) {
                    // A system error occurred
                    return false;
                }
                blocks_connected = true;

                if (fInvalidFound) {
                    // Wipe cache, we may need another branch now.
                    pindexMostWork = nullptr;
                }
                pindexNewTip = m_chain.Tip();

                for (const PerBlockConnectTrace& trace : connectTrace.GetBlocksConnected()) {
                    assert(trace.pblock && trace.pindex);
                    if (m_chainman.m_options.signals) {
                        m_chainman.m_options.signals->BlockConnected(this->GetRole(), trace.pblock, trace.pindex);
                    }
                }

                // This will have been toggled in
                // ActivateBestChainStep -> ConnectTip -> MaybeCompleteSnapshotValidation,
                // if at all, so we should catch it here.
                //
                // Break this do-while to ensure we don't advance past the base snapshot.
                if (m_disabled) {
                    break;
                }
            } while (!m_chain.Tip() || (starting_tip && CBlockIndexWorkComparator()(m_chain.Tip(), starting_tip)));
            if (!blocks_connected) return true;

            const CBlockIndex* pindexFork = m_chain.FindFork(starting_tip);
            bool still_in_ibd = m_chainman.IsInitialBlockDownload();

            if (was_in_ibd && !still_in_ibd) {
                // Active chainstate has exited IBD.
                exited_ibd = true;
            }

            // Notify external listeners about the new tip.
            // Enqueue while holding cs_main to ensure that UpdatedBlockTip is called in the order in which blocks are connected
            if (this == &m_chainman.ActiveChainstate() && pindexFork != pindexNewTip) {
                // Notify ValidationInterface subscribers
                if (m_chainman.m_options.signals) {
                    m_chainman.m_options.signals->UpdatedBlockTip(pindexNewTip, pindexFork, still_in_ibd);
                }

                // Always notify the UI if a new block tip was connected
                if (kernel::IsInterrupted(m_chainman.GetNotifications().blockTip(GetSynchronizationState(still_in_ibd, m_chainman.m_blockman.m_blockfiles_indexed), *pindexNewTip))) {
                    // Just breaking and returning success for now. This could
                    // be changed to bubble up the kernel::Interrupted value to
                    // the caller so the caller could distinguish between
                    // completed and interrupted operations.
                    break;
                }
            }
            } // release MempoolMutex
            // Notify external listeners about the new tip, even if pindexFork == pindexNewTip.
            if (m_chainman.m_options.signals && this == &m_chainman.ActiveChainstate()) {
                m_chainman.m_options.signals->ActiveTipChange(*Assert(pindexNewTip), m_chainman.IsInitialBlockDownload());
            }
        } // release cs_main
        // When we reach this point, we switched to a new tip (stored in pindexNewTip).

        if (exited_ibd) {
            // If a background chainstate is in use, we may need to rebalance our
            // allocation of caches once a chainstate exits initial block download.
            LOCK(::cs_main);
            m_chainman.MaybeRebalanceCaches();
        }

        if (WITH_LOCK(::cs_main, return m_disabled)) {
            // Background chainstate has reached the snapshot base block, so exit.

            // Restart indexes to resume indexing for all blocks unique to the snapshot
            // chain. This resumes indexing "in order" from where the indexing on the
            // background validation chain left off.
            //
            // This cannot be done while holding cs_main (within
            // MaybeCompleteSnapshotValidation) or a cs_main deadlock will occur.
            if (m_chainman.restart_indexes) {
                m_chainman.restart_indexes();
            }
            break;
        }

        // We check interrupt only after giving ActivateBestChainStep a chance to run once so that we
        // never interrupt before connecting the genesis block during LoadChainTip(). Previously this
        // caused an assert() failure during interrupt in such cases as the UTXO DB flushing checks
        // that the best block hash is non-null.
        if (m_chainman.m_interrupt) break;
    } while (pindexNewTip != pindexMostWork);

    m_chainman.CheckBlockIndex();

    // Write changes periodically to disk, after relay.
    if (!FlushStateToDisk(state, FlushStateMode::PERIODIC)) {
        return false;
    }

    return true;
}